

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness_sim.c
# Opt level: O0

void updateNewNetworkNameManager
               (Abc_Ntk_t *pNtk,Aig_Man_t *pAig,Vec_Ptr_t *vPiNames,Vec_Ptr_t *vLoNames)

{
  Vec_Ptr_t *p;
  int iVar1;
  Aig_Type_t AVar2;
  Nm_Man_t *pNVar3;
  Aig_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  int local_34;
  int ntkObjId;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vLoNames_local;
  Vec_Ptr_t *vPiNames_local;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCiNum(pNtk);
  pNVar3 = Nm_ManCreate(iVar1);
  pNtk->pManName = pNVar3;
  for (local_34 = 0; iVar1 = Saig_ManPiNum(pAig), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_34);
    pAVar5 = Abc_NtkCi(pNtk,local_34);
    iVar1 = pAVar5->Id;
    pNVar3 = pNtk->pManName;
    AVar2 = Aig_ObjType(pAVar4);
    pcVar6 = (char *)Vec_PtrEntry(vPiNames,local_34);
    Nm_ManStoreIdName(pNVar3,iVar1,AVar2,pcVar6,(char *)0x0);
  }
  for (local_34 = 0; iVar1 = Saig_ManRegNum(pAig), local_34 < iVar1; local_34 = local_34 + 1) {
    p = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,local_34 + iVar1);
    iVar1 = Saig_ManPiNum(pAig);
    pAVar5 = Abc_NtkCi(pNtk,iVar1 + local_34);
    iVar1 = pAVar5->Id;
    pNVar3 = pNtk->pManName;
    AVar2 = Aig_ObjType(pAVar4);
    pcVar6 = (char *)Vec_PtrEntry(vLoNames,local_34);
    Nm_ManStoreIdName(pNVar3,iVar1,AVar2,pcVar6,(char *)0x0);
  }
  return;
}

Assistant:

static void updateNewNetworkNameManager( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, Vec_Ptr_t *vPiNames, Vec_Ptr_t *vLoNames )
{
    Aig_Obj_t *pObj;
    int i, ntkObjId;

    pNtk->pManName = Nm_ManCreate( Abc_NtkCiNum( pNtk ) );

    Saig_ManForEachPi( pAig, pObj, i )
    {
        ntkObjId = Abc_NtkCi( pNtk, i )->Id;
        //printf("Pi %d, Saved Name = %s, id = %d\n", i, Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), Vec_PtrEntry(vPiNames, i), NULL ), ntkObjId);  
        Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), (char *)Vec_PtrEntry(vPiNames, i), NULL );
    }
    Saig_ManForEachLo( pAig, pObj, i )
    {
        ntkObjId = Abc_NtkCi( pNtk, Saig_ManPiNum( pAig ) + i )->Id;
        //printf("Lo %d, Saved name = %s, id = %d\n", i, Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), Vec_PtrEntry(vLoNames, i), NULL ), ntkObjId);  
        Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), (char *)Vec_PtrEntry(vLoNames, i), NULL );
    }
}